

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_stream.cpp
# Opt level: O1

void __thiscall duckdb::MemoryStream::~MemoryStream(MemoryStream *this)

{
  (this->super_WriteStream)._vptr_WriteStream = (_func_int **)&PTR_WriteData_01997240;
  (this->super_ReadStream)._vptr_ReadStream = (_func_int **)&DAT_01997270;
  if (((this->allocator).ptr != (Allocator *)0x0) && (this->data != (data_ptr_t)0x0)) {
    optional_ptr<duckdb::Allocator,_true>::CheckValid(&this->allocator);
    Allocator::FreeData((this->allocator).ptr,this->data,this->capacity);
  }
  return;
}

Assistant:

MemoryStream::~MemoryStream() {
	if (allocator && data) {
		allocator->FreeData(data, capacity);
	}
}